

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

void __thiscall Symbol_Table::free_subroutine(Symbol_Table *this)

{
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->subroutine_scope)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->subroutine_scope)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    puVar1 = *(undefined8 **)(p_Var2 + 2);
    if (puVar1 != (undefined8 *)0x0) {
      if ((long *)puVar1[4] != puVar1 + 6) {
        operator_delete((long *)puVar1[4],puVar1[6] + 1);
      }
      if ((long *)*puVar1 != puVar1 + 2) {
        operator_delete((long *)*puVar1,puVar1[2] + 1);
      }
      operator_delete(puVar1,0x48);
    }
  }
  return;
}

Assistant:

void Symbol_Table::free_subroutine() {
    for (auto& it : subroutine_scope) {
        delete it.second;
    }
}